

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Conn.cpp
# Opt level: O2

void __thiscall Conn::del_conn(Conn *this,int fd)

{
  iterator __position;
  int fd_local;
  
  fprintf(_stderr,"%s(%d)-<%s>: cur conn fd size %lu\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/Wangzhike[P]epoll_echo/Conn.cpp",
          0xcf,"del_conn",(this->_conn_info_map)._M_t._M_impl.super__Rb_tree_header._M_node_count);
  fflush(_stderr);
  __position = std::
               _Rb_tree<int,_std::pair<const_int,_ConnInfo>,_std::_Select1st<std::pair<const_int,_ConnInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_ConnInfo>_>_>
               ::find(&(this->_conn_info_map)._M_t,&fd_local);
  if ((_Rb_tree_header *)__position._M_node !=
      &(this->_conn_info_map)._M_t._M_impl.super__Rb_tree_header) {
    std::
    _Rb_tree<int,std::pair<int_const,ConnInfo>,std::_Select1st<std::pair<int_const,ConnInfo>>,std::less<int>,std::allocator<std::pair<int_const,ConnInfo>>>
    ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,ConnInfo>,std::_Select1st<std::pair<int_const,ConnInfo>>,std::less<int>,std::allocator<std::pair<int_const,ConnInfo>>>
                        *)&this->_conn_info_map,__position);
  }
  fd_local = fd;
  Epoll::del_event(&this->_epoll,fd,5);
  close(fd_local);
  return;
}

Assistant:

void Conn::del_conn(const int fd)
{
    LOG_PRINT("cur conn fd size %lu", _conn_info_map.size());
    if (_conn_info_map.size() < 0)
    {
        LOG_PRINT("have no fds");
        return ;
    }

    std::map<int, ConnInfo>::iterator it = _conn_info_map.find(fd);
    if (it != _conn_info_map.end())
    {
        _conn_info_map.erase(it);
    }

    _epoll.del_event(fd, EPOLLIN|EPOLLOUT);
    close(fd);
}